

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O2

uint __thiscall
ON_BinaryArchive::Dump3dmChunk(ON_BinaryArchive *this,ON_TextLog *dump,int recursion_depth)

{
  ON__UINT64 offset0;
  ON_UUID uuid_00;
  ON_UUID uuid_01;
  uint uVar1;
  int iVar2;
  bool bVar3;
  uint uVar4;
  char *pcVar5;
  ON_ClassId *pOVar6;
  byte bVar7;
  char *pcVar8;
  ON__UINT64 offset;
  ON__UINT64 OVar9;
  uchar in_stack_fffffffffffffeb8 [8];
  uint typecode;
  bool bLastSavedAsGoo;
  ON__UINT32 tcode;
  ON__UINT64 local_128;
  int minor_userdata_version;
  int major_userdata_version;
  ON__INT64 big_value;
  int local_110;
  int ud_archive_opennurbs_version;
  int ud_archive_3dm_version;
  int userdata_copycount;
  ON__INT64 local_100;
  ON_UUID userdata_classid;
  ON_UUID userdata_appid;
  ON_UUID userdata_itemid;
  ON_UUID uuid;
  
  offset = this->m_current_positionX;
  typecode = 0;
  bVar3 = BeginRead3dmBigChunk(this,&typecode,&big_value);
  if (!bVar3) {
    pcVar8 = "BeginRead3dmChunk() failed.";
    goto LAB_003dad2e;
  }
  if (typecode == 0) {
    pcVar8 = "BeginRead3dmChunk() returned typecode = 0.";
LAB_003dae49:
    Dump3dmChunk_ErrorReportHelper(offset,pcVar8,dump);
    EndRead3dmChunk(this);
    return 0;
  }
  if (recursion_depth == 0) {
    ON_TextLog::Print(dump,"\n");
  }
  uVar1 = typecode;
  pcVar5 = TypecodeName(typecode);
  pcVar8 = "unknown tcode";
  if (pcVar5 != (char *)0x0) {
    pcVar8 = pcVar5;
  }
  if ((int)uVar1 < 0) {
    pcVar5 = "%6d: %08X %s: value = %lld (%016llX)\n";
    in_stack_fffffffffffffeb8 = (uchar  [8])big_value;
  }
  else {
    if (big_value < 0) {
      pcVar8 = "BeginRead3dmChunk() returned length < 0.";
      goto LAB_003dae49;
    }
    pcVar5 = "%6d: %08X %s: length = %lld bytes\n";
  }
  ON_TextLog::Print(dump,pcVar5,offset,(ulong)uVar1,pcVar8);
  major_userdata_version = -1;
  minor_userdata_version = -1;
  if ((typecode + 0xeffffff0 < 0x17) && ((0x6f03ffU >> (typecode + 0xeffffff0 & 0x1f) & 1) != 0)) {
    ON_TextLog::PushIndent(dump);
    do {
      uVar4 = Dump3dmChunk(this,dump,recursion_depth + 1);
    } while (1 < uVar4 + 1);
    goto LAB_003db4c1;
  }
  OVar9 = offset;
  switch(typecode) {
  case 0x20008070:
    ON_TextLog::PushIndent(dump);
    while( true ) {
      do {
        do {
          uVar4 = Dump3dmChunk(this,dump,recursion_depth + 1);
        } while (uVar4 == 0x82000071);
      } while (((uVar4 == 0x27ffa) || (uVar4 == 0x2000073)) || (uVar4 == 0x2008072));
      if ((uVar4 == 0x8200007f) || (uVar4 == 0)) break;
      Dump3dmChunk_ErrorReportHelper(offset,"Rogue chunk in object record.",dump);
    }
    break;
  case 0x20008071:
  case 0x20008072:
  case 0x20008078:
  case 0x20008079:
  case 0x2000807c:
  case 0x2000807d:
  case 0x2000807e:
  case 0x2000807f:
    goto switchD_003dae7e_caseD_20008071;
  case 0x20008073:
  case 0x20008074:
  case 0x20008075:
  case 0x20008076:
  case 0x20008077:
  case 0x2000807a:
  case 0x2000807b:
    goto switchD_003dae7e_caseD_20008073;
  case 0x20008080:
switchD_003dae7e_caseD_20008080:
    ON_TextLog::PushIndent(dump);
    uuid.Data1 = 0;
    uuid.Data2 = 0;
    uuid.Data3 = 0;
    uuid.Data4[0] = '\0';
    uuid.Data4[1] = '\0';
    uuid.Data4[2] = '\0';
    uuid.Data4[3] = '\0';
    uuid.Data4[4] = '\0';
    uuid.Data4[5] = '\0';
    uuid.Data4[6] = '\0';
    uuid.Data4[7] = '\0';
    bVar3 = ReadUuid(this,&uuid);
    if (!bVar3) {
LAB_003db449:
      pcVar8 = "ReadUuid() failed.";
      goto LAB_003db453;
    }
    if (typecode == 0x20008080) {
      pcVar8 = "User table id = ";
LAB_003db46d:
      pOVar6 = (ON_ClassId *)0x0;
      ON_TextLog::Print(dump,pcVar8);
    }
    else {
      if (typecode != 0x2fffb) {
        pcVar8 = "UUID = ";
        goto LAB_003db46d;
      }
      ON_TextLog::Print(dump,"OpenNURBS class id = ");
      uuid_00.Data4[0] = in_stack_fffffffffffffeb8[0];
      uuid_00.Data4[1] = in_stack_fffffffffffffeb8[1];
      uuid_00.Data4[2] = in_stack_fffffffffffffeb8[2];
      uuid_00.Data4[3] = in_stack_fffffffffffffeb8[3];
      uuid_00.Data4[4] = in_stack_fffffffffffffeb8[4];
      uuid_00.Data4[5] = in_stack_fffffffffffffeb8[5];
      uuid_00.Data4[6] = in_stack_fffffffffffffeb8[6];
      uuid_00.Data4[7] = in_stack_fffffffffffffeb8[7];
      uuid_00.Data1 = 0x3daf1a;
      uuid_00.Data2 = 0;
      uuid_00.Data3 = 0;
      pOVar6 = ON_ClassId::ClassId(uuid_00);
    }
    ON_TextLog::Print(dump,&uuid);
    if ((pOVar6 != (ON_ClassId *)0x0) &&
       (pcVar8 = ON_ClassId::ClassName(pOVar6), pcVar8 != (char *)0x0)) {
      ON_TextLog::Print(dump," (%s)",pcVar8);
    }
    ON_TextLog::Print(dump,"\n");
    break;
  default:
    if (typecode - 0x7ffe < 2) {
      ON_TextLog::PushIndent(dump);
      if (big_value < 4) {
        pcVar8 = "TCODE_ENDOFFILE chunk withlength < 4.";
        goto LAB_003db453;
      }
      uuid.Data1 = 0;
      uuid.Data2 = 0;
      uuid.Data3 = 0;
      ReadEOFSizeOfFile(this,(ON__UINT64 *)&uuid);
      ON_TextLog::Print(dump,"current position = %d  stored size = %llu\n",this->m_current_positionX
                        ,uuid._0_8_);
    }
    else {
      if (typecode == 0xa0000026) {
        ON_TextLog::PushIndent(dump);
        ON_TextLog::Print(dump,"Version of opennurbs that wrote this file: %lld\n",big_value);
        ON_TextLog::PopIndent(dump);
        if (big_value - 1U >> 1 < 0x7fffffff && this->m_3dm_opennurbs_version == 0) {
          ON_SetBinaryArchiveOpenNURBSVersion(this,(uint)big_value);
        }
        goto switchD_003dae7e_caseD_20008071;
      }
      if (typecode == 0x27ffa) {
        ON_TextLog::PushIndent(dump);
        while( true ) {
          do {
            do {
              uVar4 = Dump3dmChunk(this,dump,recursion_depth + 1);
            } while (uVar4 - 0x2fffb < 2);
          } while (uVar4 == 0x27ffd);
          if ((uVar4 == 0x80027fff) || (uVar4 == 0)) break;
          Dump3dmChunk_ErrorReportHelper(offset,"Rogue chunk in OpenNURBS class record.",dump);
        }
      }
      else if (typecode == 0x27ffd) {
        bVar3 = Read3dmChunkVersion(this,&major_userdata_version,&minor_userdata_version);
        if (!bVar3) {
          pcVar8 = 
          "Read3dmChunkVersion() failed to read TCODE_OPENNURBS_CLASS_USERDATA chunk version.";
          goto LAB_003db38a;
        }
        ON_TextLog::PushIndent(dump);
        ON_TextLog::Print(dump,"UserData chunk version: %d.%d\n",(ulong)(uint)major_userdata_version
                          ,(ulong)(uint)minor_userdata_version);
        iVar2 = major_userdata_version;
        if (1 < major_userdata_version - 1U) break;
        local_128 = this->m_current_positionX;
        local_110 = minor_userdata_version;
        userdata_classid.Data1 = 0;
        userdata_classid.Data2 = 0;
        userdata_classid.Data3 = 0;
        userdata_classid.Data4[0] = '\0';
        userdata_classid.Data4[1] = '\0';
        userdata_classid.Data4[2] = '\0';
        userdata_classid.Data4[3] = '\0';
        userdata_classid.Data4[4] = '\0';
        userdata_classid.Data4[5] = '\0';
        userdata_classid.Data4[6] = '\0';
        userdata_classid.Data4[7] = '\0';
        userdata_itemid.Data1 = 0;
        userdata_itemid.Data2 = 0;
        userdata_itemid.Data3 = 0;
        userdata_itemid.Data4[0] = '\0';
        userdata_itemid.Data4[1] = '\0';
        userdata_itemid.Data4[2] = '\0';
        userdata_itemid.Data4[3] = '\0';
        userdata_itemid.Data4[4] = '\0';
        userdata_itemid.Data4[5] = '\0';
        userdata_itemid.Data4[6] = '\0';
        userdata_itemid.Data4[7] = '\0';
        userdata_appid.Data1 = 0;
        userdata_appid.Data2 = 0;
        userdata_appid.Data3 = 0;
        userdata_appid.Data4[0] = '\0';
        userdata_appid.Data4[1] = '\0';
        userdata_appid.Data4[2] = '\0';
        userdata_appid.Data4[3] = '\0';
        userdata_appid.Data4[4] = '\0';
        userdata_appid.Data4[5] = '\0';
        userdata_appid.Data4[6] = '\0';
        userdata_appid.Data4[7] = '\0';
        userdata_copycount = -1;
        ON_Xform::ON_Xform((ON_Xform *)&uuid);
        ud_archive_3dm_version = 0;
        ud_archive_opennurbs_version = 0;
        tcode = 0;
        local_100 = 0;
        bLastSavedAsGoo = false;
        offset0 = this->m_current_positionX;
        if (iVar2 == 2) {
          bVar3 = PeekAt3dmBigChunkType(this,&tcode,&local_100);
          if ((bVar3) && (tcode == 0x2fff9)) {
            bVar3 = BeginRead3dmBigChunk(this,&tcode,&local_100);
            if (bVar3) {
              if (tcode != 0x2fff9) {
                Dump3dmChunk_ErrorReportHelper
                          (local_128,
                           "Missing TCODE_OPENNURBS_CLASS_USERDATA_HEADER chunk header in a TCODE_OPENNURBS_CLASS_USERDATA chunk."
                           ,dump);
                Dump3dmChunk_EndReadChunkHelper(this,offset0,tcode,local_100,dump);
                break;
              }
              goto LAB_003db0b2;
            }
            pcVar8 = 
            "Unable to read the TCODE_OPENNURBS_CLASS_USERDATA_HEADER chunk header in a TCODE_OPENNURBS_CLASS_USERDATA chunk."
            ;
            OVar9 = local_128;
          }
          else {
            pcVar8 = 
            "Unable to find the TCODE_OPENNURBS_CLASS_USERDATA_HEADER chunk header in a TCODE_OPENNURBS_CLASS_USERDATA chunk."
            ;
            OVar9 = local_128;
          }
        }
        else {
LAB_003db0b2:
          bVar3 = ReadUuid(this,&userdata_classid);
          if (bVar3) {
            ON_TextLog::Print(dump,"UserData class id = ");
            ON_TextLog::Print(dump,&userdata_classid);
            uuid_01.Data4[0] = in_stack_fffffffffffffeb8[0];
            uuid_01.Data4[1] = in_stack_fffffffffffffeb8[1];
            uuid_01.Data4[2] = in_stack_fffffffffffffeb8[2];
            uuid_01.Data4[3] = in_stack_fffffffffffffeb8[3];
            uuid_01.Data4[4] = in_stack_fffffffffffffeb8[4];
            uuid_01.Data4[5] = in_stack_fffffffffffffeb8[5];
            uuid_01.Data4[6] = in_stack_fffffffffffffeb8[6];
            uuid_01.Data4[7] = in_stack_fffffffffffffeb8[7];
            uuid_01.Data1 = 0x3db0f6;
            uuid_01.Data2 = 0;
            uuid_01.Data3 = 0;
            pOVar6 = ON_ClassId::ClassId(uuid_01);
            if ((pOVar6 != (ON_ClassId *)0x0) &&
               (pcVar8 = ON_ClassId::ClassName(pOVar6), pcVar8 != (char *)0x0)) {
              ON_TextLog::Print(dump," (%s)",pcVar8);
            }
            ON_TextLog::Print(dump,"\n");
            bVar3 = ReadUuid(this,&userdata_itemid);
            if (!bVar3) {
              pcVar8 = "ReadUuid() failed to read the user data item id.";
              goto LAB_003db571;
            }
            ON_TextLog::Print(dump,"UserData item id = ");
            ON_TextLog::Print(dump,&userdata_itemid);
            ON_TextLog::Print(dump,"\n");
            bVar3 = ReadInt(this,&userdata_copycount);
            if (!bVar3) {
              pcVar8 = "ReadInt() failed to read the user data copy count.";
              goto LAB_003db571;
            }
            ON_TextLog::Print(dump,"UserData copy count = %d\n",(ulong)(uint)userdata_copycount);
            bVar3 = ReadXform(this,(ON_Xform *)&uuid);
            if (!bVar3) {
              pcVar8 = "ReadXform() failed to read the user data xform.";
              goto LAB_003db571;
            }
            bVar7 = 1;
            if (local_110 < 1 || iVar2 != 2) goto LAB_003db580;
            bVar3 = ReadUuid(this,&userdata_appid);
            if (bVar3) {
              ON_TextLog::Print(dump,"UserData app plug-in id = ");
              ON_TextLog::Print(dump,&userdata_appid);
              ON_TextLog::Print(dump,"\n");
              if (local_110 != 1) {
                bVar3 = ReadBool(this,&bLastSavedAsGoo);
                if (((!bVar3) || (bVar3 = ReadInt(this,&ud_archive_3dm_version), !bVar3)) ||
                   (bVar3 = ReadInt(this,&ud_archive_opennurbs_version), !bVar3)) {
                  pcVar8 = "ReadBool() failed to read the user data header bSavedAsGoo value.";
                  goto LAB_003db67e;
                }
                if (bLastSavedAsGoo == true) {
                  pcVar8 = 
                  "Userdata originally written by opennurbs %d in 3dm version %d and saved as goo in this file.\n"
                  ;
                }
                else {
                  pcVar8 = "Userdata written by opennurbs %d in 3dm version %d.\n";
                }
                ON_TextLog::Print(dump,pcVar8,(ulong)(uint)ud_archive_opennurbs_version,
                                  (ulong)(uint)ud_archive_3dm_version);
              }
              bVar7 = 1;
            }
            else {
              pcVar8 = "ReadUuid() failed to read the user data app plug-in id.";
LAB_003db67e:
              Dump3dmChunk_ErrorReportHelper(local_128,pcVar8,dump);
              bVar7 = 0;
            }
LAB_003db586:
            bVar3 = Dump3dmChunk_EndReadChunkHelper(this,offset0,tcode,local_100,dump);
            if (bVar7 == 1 && !bVar3) {
              pcVar8 = 
              "EndRead3dmChunk() failed to close the TCODE_OPENNURBS_CLASS_USERDATA_HEADER chunk.";
              OVar9 = local_128;
              goto LAB_003db453;
            }
            bVar7 = bVar7 & bVar3;
          }
          else {
            pcVar8 = "ReadUuid() failed to read the user data class id.";
LAB_003db571:
            Dump3dmChunk_ErrorReportHelper(local_128,pcVar8,dump);
            bVar7 = 0;
LAB_003db580:
            if (iVar2 == 2) goto LAB_003db586;
          }
          if ((bVar7 == 0) ||
             (uVar4 = Dump3dmChunk(this,dump,recursion_depth + 1), uVar4 == 0x40008000)) break;
          pcVar8 = "Userdata Expected a TCODE_ANONYMOUS_CHUNK chunk.";
        }
LAB_003db453:
        Dump3dmChunk_ErrorReportHelper(OVar9,pcVar8,dump);
      }
      else {
        if (typecode == 0x2fff9) {
          pcVar8 = 
          "Encountered TCODE_OPENNURBS_CLASS_USERDATA_HEADER chunk outside a TCODE_OPENNURBS_CLASS_USERDATA chunk."
          ;
LAB_003db38a:
          Dump3dmChunk_ErrorReportHelper(offset,pcVar8,dump);
          goto switchD_003dae7e_caseD_20008071;
        }
        if (typecode == 0x2fffb) goto switchD_003dae7e_caseD_20008080;
        if (typecode == 0x2008072) {
          ON_TextLog::PushIndent(dump);
          if (big_value < 0xe) {
            pcVar8 = "Length of chunk is too small.  Should be >= 14.";
          }
          else {
            uuid.Data1 = 0;
            uuid.Data2 = 0;
            uuid.Data3 = 0;
            uuid.Data4[0] = '\0';
            uuid.Data4[1] = '\0';
            uuid.Data4[2] = '\0';
            uuid.Data4[3] = '\0';
            uuid.Data4[4] = '\0';
            uuid.Data4[5] = '\0';
            uuid.Data4[6] = '\0';
            uuid.Data4[7] = '\0';
            userdata_classid.Data1 = 0xffffff9d;
            userdata_itemid.Data1 = 0xffffffff;
            userdata_appid.Data1 = 0xffffffff;
            bVar3 = Read3dmChunkVersion(this,(int *)&userdata_itemid,(int *)&userdata_appid);
            if (bVar3) {
              bVar3 = ReadUuid(this,&uuid);
              if (!bVar3) goto LAB_003db449;
              bVar3 = ReadInt(this,(ON__INT32 *)&userdata_classid);
              if (bVar3) {
                ON_TextLog::Print(dump,"Rhino object uuid: ");
                ON_TextLog::Print(dump,&uuid);
                ON_TextLog::Print(dump,"\n");
                ON_TextLog::Print(dump,"layer index: %d\n",userdata_classid._0_8_ & 0xffffffff);
                break;
              }
              pcVar8 = "ReadInt() failed to read layer index.";
            }
            else {
              pcVar8 = "Read3dmChunkVersion() failed.";
            }
          }
          goto LAB_003db453;
        }
        if ((typecode != 0x20008040) && (typecode != 0x20008050)) {
          if (typecode == 0x20008060) {
            ON_TextLog::PushIndent(dump);
            while( true ) {
              do {
                do {
                  uVar4 = Dump3dmChunk(this,dump,recursion_depth + 1);
                } while (uVar4 == 0x27ffa);
              } while ((uVar4 == 0x2000062) || (uVar4 == 0x2008061));
              if ((uVar4 == 0x8200006f) || (uVar4 == 0)) break;
              Dump3dmChunk_ErrorReportHelper(offset,"Rogue chunk in light record.",dump);
            }
            break;
          }
          if (typecode != 0x20008090) goto switchD_003dae7e_caseD_20008071;
        }
switchD_003dae7e_caseD_20008073:
        ON_TextLog::PushIndent(dump);
        uVar4 = Dump3dmChunk(this,dump,recursion_depth + 1);
        if (typecode == 0) {
          typecode = uVar4;
        }
      }
    }
  }
LAB_003db4c1:
  ON_TextLog::PopIndent(dump);
switchD_003dae7e_caseD_20008071:
  OVar9 = this->m_current_positionX;
  bVar3 = EndRead3dmChunk(this,true);
  if (bVar3) {
    if ((int)uVar1 < 0) {
      return typecode;
    }
    if (-1 < (long)((offset - OVar9) + big_value + (ulong)(0x31 < this->m_3dm_version) * 4 + 8)) {
      return typecode;
    }
    pcVar8 = "Read beyond end of chunk.";
  }
  else {
    pcVar8 = "EndRead3dmChunk() failed.";
    offset = OVar9;
  }
LAB_003dad2e:
  Dump3dmChunk_ErrorReportHelper(offset,pcVar8,dump);
  return typecode;
}

Assistant:

unsigned int 
ON_BinaryArchive::Dump3dmChunk( ON_TextLog& dump, int recursion_depth )
{
  //ON_BinaryArchive& file = *this;
  const char* typecode_name = 0;
  bool bShortChunk = false;
  const ON__UINT64 offset0 = CurrentPosition();
  unsigned int typecode = 0;
  ON__INT64 big_value;
  bool rc = BeginRead3dmBigChunk( &typecode, &big_value );
  if (!rc) 
  {
    Dump3dmChunk_ErrorReportHelper(offset0,"BeginRead3dmChunk() failed.",dump);
  }
  else 
  {
    if ( 0 == typecode ) 
    {
      Dump3dmChunk_ErrorReportHelper(offset0,"BeginRead3dmChunk() returned typecode = 0.",dump);
      EndRead3dmChunk();
      return 0;
    }
    else {
      if ( 0 == recursion_depth )
      {
        dump.Print("\n");
      }

      ////bShortChunk = (0 != (typecode & TCODE_SHORT));
      typecode_name = ON_BinaryArchive::TypecodeName(typecode);
      bShortChunk = (0 != (typecode & TCODE_SHORT));
      if ( !DumpChunk_PrintHeaderInfo(offset0,typecode,big_value,typecode_name,dump) )
      {
        EndRead3dmChunk();
        return 0;
      }

      int major_userdata_version = -1;
      int minor_userdata_version = -1;

      switch( typecode ) 
      {
      case TCODE_PROPERTIES_TABLE:
      case TCODE_SETTINGS_TABLE:
      case TCODE_BITMAP_TABLE:
      case TCODE_MATERIAL_TABLE:
      case TCODE_LAYER_TABLE:
      case TCODE_GROUP_TABLE:
      case TCODE_LIGHT_TABLE:
      case TCODE_FONT_TABLE:
      case TCODE_DIMSTYLE_TABLE:
      case TCODE_HATCHPATTERN_TABLE:
      case TCODE_LINETYPE_TABLE:
      case TCODE_TEXTURE_MAPPING_TABLE:
      case TCODE_HISTORYRECORD_TABLE:
      case TCODE_USER_TABLE:
      case TCODE_INSTANCE_DEFINITION_TABLE:
      case TCODE_OBJECT_TABLE:
        // start of a table
        {
          dump.PushIndent();
          unsigned int record_typecode = 0;
          for (;;) {
            record_typecode = Dump3dmChunk( dump, recursion_depth+1 );
            if ( !record_typecode ) {
              break;
            }
            if ( TCODE_ENDOFTABLE == record_typecode ) {
              break;
            }
          }
          dump.PopIndent();
        }
        break;

      case TCODE_PROPERTIES_OPENNURBS_VERSION:
        {
          dump.PushIndent();
          dump.Print("Version of opennurbs that wrote this file: %lld\n",big_value);
          dump.PopIndent();           
          if (0 == m_3dm_opennurbs_version && big_value > 0 && ((ON__UINT64)big_value) < ON_UNSET_UINT_INDEX)
            ON_SetBinaryArchiveOpenNURBSVersion(*this,(ON__UINT32)big_value);
        }
        break;

      case TCODE_BITMAP_RECORD:
        {
          dump.PushIndent();
          unsigned int bitmap_chunk_typecode = Dump3dmChunk( dump, recursion_depth+1 );
          if ( 0 == typecode )
            typecode = bitmap_chunk_typecode;
          dump.PopIndent();
        }
        break;

      case TCODE_MATERIAL_RECORD:
        {
          dump.PushIndent();
          unsigned int material_chunk_typecode = Dump3dmChunk( dump, recursion_depth+1 );
          if ( 0 == typecode )
            typecode = material_chunk_typecode;
          dump.PopIndent();
        }
        break;

      case TCODE_LAYER_RECORD:
        {
          dump.PushIndent();
          unsigned int material_chunk_typecode = Dump3dmChunk( dump, recursion_depth+1 );
          if ( 0 == typecode )
            typecode = material_chunk_typecode;
          dump.PopIndent();
        }
        break;

      case TCODE_GROUP_RECORD:
        {
          dump.PushIndent();
          unsigned int group_chunk_typecode = Dump3dmChunk( dump, recursion_depth+1 );
          if ( 0 == typecode )
            typecode = group_chunk_typecode;
          dump.PopIndent();
        }
        break;

      case TCODE_FONT_RECORD:
        {
          dump.PushIndent();
          unsigned int font_chunk_typecode = Dump3dmChunk( dump, recursion_depth+1 );
          if ( 0 == typecode )
            typecode = font_chunk_typecode;
          dump.PopIndent();
        }
        break;

      case TCODE_DIMSTYLE_RECORD:
        {
          dump.PushIndent();
          unsigned int dimstyle_chunk_typecode = Dump3dmChunk( dump, recursion_depth+1 );
          if ( 0 == typecode )
            typecode = dimstyle_chunk_typecode;
          dump.PopIndent();
        }
        break;

      case TCODE_LIGHT_RECORD:
        {
          dump.PushIndent();
          unsigned int light_chunk_typecode = 0;
          for (;;) {
            light_chunk_typecode = Dump3dmChunk( dump, recursion_depth+1 );
            if ( !light_chunk_typecode ) {
              break;
            }
            if ( TCODE_LIGHT_RECORD_END == light_chunk_typecode ) {
              break;
            }
            switch( light_chunk_typecode ) {
            //case TCODE_OBJECT_RECORD_TYPE:
            case TCODE_LIGHT_RECORD_ATTRIBUTES:
            case TCODE_LIGHT_RECORD_ATTRIBUTES_USERDATA:
            case TCODE_OPENNURBS_CLASS:
              break;
            default:
              {
                Dump3dmChunk_ErrorReportHelper(offset0,"Rogue chunk in light record.",dump);
              }
            }
          }
          dump.PopIndent();
        }
        break;

      case TCODE_TEXTURE_MAPPING_RECORD:
        {
          dump.PushIndent();
          unsigned int mapping_chunk_typecode = Dump3dmChunk( dump, recursion_depth+1 );
          if ( !typecode )
            typecode = mapping_chunk_typecode;
          dump.PopIndent();
        }
        break;

      case TCODE_HISTORYRECORD_RECORD:
        {
          dump.PushIndent();
          unsigned int history_chunk_typecode = Dump3dmChunk( dump, recursion_depth+1 );
          if ( !typecode )
            typecode = history_chunk_typecode;
          dump.PopIndent();
        }
        break;

      case TCODE_HATCHPATTERN_RECORD:
        {
          dump.PushIndent();
          unsigned int hatch_chunk_typecode = Dump3dmChunk( dump, recursion_depth+1 );
          if ( !typecode )
            typecode = hatch_chunk_typecode;
          dump.PopIndent();
        }
        break;

      case TCODE_INSTANCE_DEFINITION_RECORD:
        {
          dump.PushIndent();
          unsigned int idef_chunk_typecode = Dump3dmChunk( dump, recursion_depth+1 );
          if ( 0 == typecode )
            typecode = idef_chunk_typecode;
          dump.PopIndent();
        }
        break;

      case TCODE_OBJECT_RECORD:
        {
          dump.PushIndent();
          unsigned int object_chunk_typecode = 0;
          for (;;) {
            object_chunk_typecode = Dump3dmChunk( dump, recursion_depth+1 );
            if ( !object_chunk_typecode ) {
              break;
            }
            if ( TCODE_OBJECT_RECORD_END == object_chunk_typecode ) {
              break;
            }
            switch( object_chunk_typecode ) {
            case TCODE_OBJECT_RECORD_TYPE:
            case TCODE_OBJECT_RECORD_ATTRIBUTES:
            case TCODE_OBJECT_RECORD_ATTRIBUTES_USERDATA:
            case TCODE_OPENNURBS_CLASS:
              break;
            default:
              {
                Dump3dmChunk_ErrorReportHelper(offset0,"Rogue chunk in object record.",dump);
              }
            }
          }
          dump.PopIndent();
        }
        break;

      case TCODE_OBJECT_RECORD_ATTRIBUTES:
        {
          dump.PushIndent();
          if ( big_value < 14 )
          {
            Dump3dmChunk_ErrorReportHelper(offset0,"Length of chunk is too small.  Should be >= 14.",dump);
          }
          else
          {
            ON_UUID uuid = ON_nil_uuid;
            int layer_index = -99;
            int mj = -1;
            int mn = -1;
            if ( !Read3dmChunkVersion(&mj,&mn))
            {
              Dump3dmChunk_ErrorReportHelper(offset0,"Read3dmChunkVersion() failed.",dump);
            }
            else if (!ReadUuid(uuid))
            {
              Dump3dmChunk_ErrorReportHelper(offset0,"ReadUuid() failed.",dump);
            }
            else if ( !ReadInt(&layer_index) )
            {
              Dump3dmChunk_ErrorReportHelper(offset0,"ReadInt() failed to read layer index.",dump);
            }
            else
            {
              dump.Print("Rhino object uuid: ");
              dump.Print(uuid);
              dump.Print("\n");
              dump.Print("layer index: %d\n",layer_index);
            }
          }
          dump.PopIndent();
        }
        break;

      case TCODE_OPENNURBS_CLASS:
        {
          dump.PushIndent();
          unsigned int opennurbs_object_chunk_typecode = 0;
          for (;;) {
            opennurbs_object_chunk_typecode = Dump3dmChunk( dump, recursion_depth+1  );
            if ( !opennurbs_object_chunk_typecode ) {
              break;
            }
            if ( TCODE_OPENNURBS_CLASS_END == opennurbs_object_chunk_typecode ) {
              break;
            }
            switch( opennurbs_object_chunk_typecode ) 
            {
            case TCODE_OPENNURBS_CLASS_UUID:
              break;
            case TCODE_OPENNURBS_CLASS_DATA:
              break;
            case TCODE_OPENNURBS_CLASS_USERDATA:
              break;
            default:
              {
                Dump3dmChunk_ErrorReportHelper(offset0,"Rogue chunk in OpenNURBS class record.",dump);
              }
            }
          }
          dump.PopIndent();
        }
        break;

      case TCODE_OPENNURBS_CLASS_USERDATA:
        {
          if ( !Read3dmChunkVersion(&major_userdata_version, &minor_userdata_version ) )
          {
            Dump3dmChunk_ErrorReportHelper(offset0,"Read3dmChunkVersion() failed to read TCODE_OPENNURBS_CLASS_USERDATA chunk version.",dump);
          }
          else
          {
            dump.PushIndent();
            dump.Print("UserData chunk version: %d.%d\n",
                       major_userdata_version,
                       minor_userdata_version
                       );
            if ( 1 == major_userdata_version || 2 == major_userdata_version )
            {
              const ON__UINT64 userdata_header_offset = CurrentPosition();
              switch ( major_userdata_version )
              {
              case 1:
              case 2:
                {
                  // version 1 user data header information was not wrapped
                  // in a chunk.
                  //
                  // version 2 user data header information is wrapped
                  // in a TCODE_OPENNURBS_CLASS_USERDATA_HEADER chunk.
                  if ( Dump3dmChunk_UserDataHeaderHelper( 
                                  userdata_header_offset, *this, 
                                  major_userdata_version, minor_userdata_version,
                                  dump ) 
                     )
                  {
                    // a TCODE_ANONYMOUS_CHUNK contains user data goo
                    int anon_typecode =  Dump3dmChunk( dump, recursion_depth+1 );
                    if ( TCODE_ANONYMOUS_CHUNK != anon_typecode )
                    {
                      Dump3dmChunk_ErrorReportHelper( offset0,"Userdata Expected a TCODE_ANONYMOUS_CHUNK chunk.",dump);
                    }
                  }
                }
                break;
              default:
                if ( major_userdata_version < 3 )
                {
                }
                else
                {
                  dump.Print("New user data format created after this diagnostic tool was written.\n");
                }
                break;
              }
            }

            dump.PopIndent();
          }
        }
        break;

      case TCODE_OPENNURBS_CLASS_UUID:
      case TCODE_USER_TABLE_UUID:
        {
          dump.PushIndent();
          ON_UUID uuid = ON_nil_uuid;
          const ON_ClassId* pClassId = 0;
          if ( !ReadUuid( uuid ) ) {
             Dump3dmChunk_ErrorReportHelper(offset0,"ReadUuid() failed.",dump);
          }
          else 
          {
            if ( typecode == TCODE_OPENNURBS_CLASS_UUID ) 
            {
              dump.Print("OpenNURBS class id = ");
              pClassId = ON_ClassId::ClassId(uuid);
            }
            else if ( typecode == TCODE_USER_TABLE_UUID ) 
            {
              dump.Print("User table id = ");
            }
            else {
              dump.Print("UUID = ");
            }
            dump.Print( uuid );
            if ( pClassId )
            {
              const char* sClassName = pClassId->ClassName();
              if ( sClassName )
              {
                dump.Print(" (%s)",sClassName);
              }
            }
            dump.Print("\n");
          }

          dump.PopIndent();
        }
        break;

      case TCODE_OPENNURBS_CLASS_USERDATA_HEADER:
        {
          // we should never get here because this chunk is parsed in the TCODE_OPENNURBS_CLASS_USERDATA case above.
          Dump3dmChunk_ErrorReportHelper(offset0,"Encountered TCODE_OPENNURBS_CLASS_USERDATA_HEADER chunk outside a TCODE_OPENNURBS_CLASS_USERDATA chunk.",dump);
        }
        break;

      case TCODE_ENDOFFILE:
      case TCODE_ENDOFFILE_GOO:
        {
          dump.PushIndent();
          if ( big_value < 4 ) {
            Dump3dmChunk_ErrorReportHelper(offset0,"TCODE_ENDOFFILE chunk withlength < 4.",dump);
          }
          else {
            ON__UINT64 sizeof_file = 0;
            ReadEOFSizeOfFile(&sizeof_file);
            dump.Print("current position = %d  stored size = %llu\n",
                       CurrentPosition(), 
                       sizeof_file
                       );
          }
          dump.PopIndent();
        }
        break;

      }
    }

    const ON__UINT64 offset1 = CurrentPosition();
    if ( !EndRead3dmChunk(true) ) 
    {
      Dump3dmChunk_ErrorReportHelper(offset1,"EndRead3dmChunk() failed.",dump);
      rc = false;
    }
    else if (!bShortChunk) 
    {
      ON__INT64 delta =  (offset1 > offset0)
                ?  ((ON__INT64)(offset1 - offset0))
                : -((ON__INT64)(offset0 - offset1));
      const ON__INT64 extra = big_value - (delta-4-SizeofChunkLength());
      if ( extra < 0 ) 
      {
        Dump3dmChunk_ErrorReportHelper(offset0,"Read beyond end of chunk.",dump);
      }
    }
  }
  return typecode;
}